

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

bool __thiscall
HighsCutGeneration::finalizeAndAddCut
          (HighsCutGeneration *this,vector<int,_std::allocator<int>_> *inds_,
          vector<double,_std::allocator<double>_> *vals_,double *rhs_)

{
  int iVar1;
  pointer puVar2;
  pointer piVar3;
  double *pdVar4;
  HighsInt *Rindex;
  bool bVar5;
  HighsInt HVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  puVar2 = (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  piVar3 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = (uint)((ulong)((long)(inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  this->rowlen = uVar8;
  this->inds = piVar3;
  this->vals = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
  (this->rhs).hi = *rhs_;
  (this->rhs).lo = 0.0;
  this->integralSupport = true;
  this->integralCoefficients = false;
  if (0 < (int)uVar8) {
    lVar9 = (ulong)(uVar8 & 0x7fffffff) + 1;
    do {
      pdVar4 = this->vals;
      if ((pdVar4[lVar9 + -2] != 0.0) || (NAN(pdVar4[lVar9 + -2]))) {
        bVar5 = HighsLpRelaxation::isColIntegral(this->lpRelaxation,this->inds[lVar9 + -2]);
        this->integralSupport = (bool)(this->integralSupport & bVar5);
      }
      else {
        iVar1 = this->rowlen;
        this->rowlen = iVar1 + -1;
        this->inds[lVar9 + -2] = this->inds[(long)iVar1 + -1];
        pdVar4[lVar9 + -2] = pdVar4[this->rowlen];
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  std::vector<double,_std::allocator<double>_>::resize(vals_,(long)this->rowlen);
  std::vector<int,_std::allocator<int>_>::resize(inds_,(long)this->rowlen);
  bVar5 = postprocessCut(this);
  if (bVar5) {
    *rhs_ = (this->rhs).hi + (this->rhs).lo;
    std::vector<double,_std::allocator<double>_>::resize(vals_,(long)this->rowlen);
    std::vector<int,_std::allocator<int>_>::resize(inds_,(long)this->rowlen);
    dVar10 = -*rhs_;
    uVar8 = this->rowlen;
    if ((ulong)uVar8 == 0) {
      dVar12 = 0.0;
    }
    else {
      dVar12 = 0.0;
      uVar7 = 0;
      dVar11 = dVar10;
      do {
        dVar13 = (this->lpRelaxation->lpsolver).solution_.col_value.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[this->inds[uVar7]] *
                 (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        dVar10 = dVar11 + dVar13;
        dVar12 = dVar12 + (dVar11 - (dVar10 - dVar13)) + (dVar13 - (dVar10 - (dVar10 - dVar13)));
        uVar7 = uVar7 + 1;
        dVar11 = dVar10;
      } while (uVar8 != uVar7);
    }
    if (this->feastol * 10.0 < dVar12 + dVar10) {
      HighsDomain::tightenCoefficients
                ((HighsDomain *)
                 ((long)(this->lpRelaxation->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x390),this->inds,
                 this->vals,uVar8,rhs_);
      Rindex = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      HVar6 = HighsCutPool::addCut
                        (this->cutpool,this->lpRelaxation->mipsolver,Rindex,
                         (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (HighsInt)
                         ((ulong)((long)(inds_->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)Rindex) >>
                         2),*rhs_,(bool)(this->integralCoefficients & this->integralSupport),true,
                         true,false);
      return HVar6 != -1;
    }
  }
  return false;
}

Assistant:

bool HighsCutGeneration::finalizeAndAddCut(std::vector<HighsInt>& inds_,
                                           std::vector<double>& vals_,
                                           double& rhs_) {
  complementation.clear();
  rowlen = inds_.size();
  inds = inds_.data();
  vals = vals_.data();
  rhs = rhs_;

  integralSupport = true;
  integralCoefficients = false;
  // remove zeros in place
  for (HighsInt i = rowlen - 1; i >= 0; --i) {
    if (vals[i] == 0.0) {
      --rowlen;
      inds[i] = inds[rowlen];
      vals[i] = vals[rowlen];
    } else {
      integralSupport &= lpRelaxation.isColIntegral(inds[i]);
    }
  }

  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(inds, vals,
                                                               rowlen, rhs_);
  // apply cut postprocessing including scaling and removal of small
  // coefficients
  if (!postprocessCut()) return false;
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
      inds_.data(), vals_.data(), rowlen, rhs_);

  // finally determine the violation of the cut in the original space
  HighsCDouble violation = -rhs_;
  const auto& sol = lpRelaxation.getSolution().col_value;
  for (HighsInt i = 0; i != rowlen; ++i) violation += sol[inds[i]] * vals_[i];

  if (violation <= 10 * feastol) return false;

  lpRelaxation.getMipSolver().mipdata_->domain.tightenCoefficients(
      inds, vals, rowlen, rhs_);

  // if the cut is violated by a small factor above the feasibility
  // tolerance, add it to the cutpool
  HighsInt cutindex = cutpool.addCut(lpRelaxation.getMipSolver(), inds_.data(),
                                     vals_.data(), inds_.size(), rhs_,
                                     integralSupport && integralCoefficients);

  // only return true if cut was accepted by the cutpool, i.e. not a duplicate
  // of a cut already in the pool
  return cutindex != -1;
}